

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<int>(uint length,int value)

{
  bool bVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  shared_ptr<int> pa;
  shared_ptr<int> pb;
  
  uVar14 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar14 = (ulong)(length + 1) * 4;
  }
  piVar4 = (int *)operator_new__(uVar14);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,piVar4,nosimd::common::free<int>);
  pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar14);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<int>);
  _Var3._M_pi = pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar14 = (ulong)length;
  piVar4[uVar14] = 0x7f;
  *(undefined4 *)
   ((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar14 * 4) = 0x3f;
  uVar12 = (int)length >> 2;
  piVar5 = piVar4;
  uVar11 = uVar12;
  uVar10 = uVar12;
  if (3 < (int)uVar12) {
    do {
      *piVar5 = value;
      piVar5[1] = value;
      piVar5[2] = value;
      piVar5[3] = value;
      piVar5[4] = value;
      piVar5[5] = value;
      piVar5[6] = value;
      piVar5[7] = value;
      piVar5[8] = value;
      piVar5[9] = value;
      piVar5[10] = value;
      piVar5[0xb] = value;
      piVar5[0xc] = value;
      piVar5[0xd] = value;
      piVar5[0xe] = value;
      piVar5[0xf] = value;
      uVar10 = uVar11 - 4;
      piVar5 = piVar5 + 0x10;
      bVar1 = 7 < uVar11;
      uVar11 = uVar10;
    } while (bVar1);
  }
  if (1 < (int)uVar10) {
    *piVar5 = value;
    piVar5[1] = value;
    piVar5[2] = value;
    piVar5[3] = value;
    piVar5[4] = value;
    piVar5[5] = value;
    piVar5[6] = value;
    piVar5[7] = value;
    uVar10 = uVar10 - 2;
    piVar5 = piVar5 + 8;
  }
  if (uVar10 != 0) {
    *piVar5 = value;
    piVar5[1] = value;
    piVar5[2] = value;
    piVar5[3] = value;
  }
  uVar10 = length & 0xfffffffc;
  if (uVar10 != length) {
    lVar6 = (long)(int)uVar10;
    do {
      piVar4[lVar6] = value;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)length);
  }
  if (length != 0) {
    uVar7 = 0;
    do {
      if (piVar4[uVar7] != value) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar9 + 1) = 0x16;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar14 != uVar7);
    _Var8._M_pi = pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    piVar5 = piVar4;
    uVar11 = uVar12;
    uVar13 = uVar12;
    if (3 < (int)uVar12) {
      do {
        iVar15 = piVar5[2];
        iVar2 = piVar5[3];
        (_Var8._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)piVar5;
        (_Var8._M_pi)->_M_use_count = iVar15;
        (_Var8._M_pi)->_M_weak_count = iVar2;
        iVar15 = piVar5[6];
        iVar2 = piVar5[7];
        _Var8._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 4);
        _Var8._M_pi[1]._M_use_count = iVar15;
        _Var8._M_pi[1]._M_weak_count = iVar2;
        iVar15 = piVar5[10];
        iVar2 = piVar5[0xb];
        _Var8._M_pi[2]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 8);
        _Var8._M_pi[2]._M_use_count = iVar15;
        _Var8._M_pi[2]._M_weak_count = iVar2;
        iVar15 = piVar5[0xe];
        iVar2 = piVar5[0xf];
        _Var8._M_pi[3]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 0xc);
        _Var8._M_pi[3]._M_use_count = iVar15;
        _Var8._M_pi[3]._M_weak_count = iVar2;
        uVar11 = uVar13 - 4;
        piVar5 = piVar5 + 0x10;
        _Var8._M_pi = _Var8._M_pi + 4;
        bVar1 = 7 < uVar13;
        uVar13 = uVar11;
      } while (bVar1);
    }
    if (1 < (int)uVar11) {
      iVar15 = piVar5[2];
      iVar2 = piVar5[3];
      (_Var8._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)piVar5;
      (_Var8._M_pi)->_M_use_count = iVar15;
      (_Var8._M_pi)->_M_weak_count = iVar2;
      iVar15 = piVar5[6];
      iVar2 = piVar5[7];
      _Var8._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 4);
      _Var8._M_pi[1]._M_use_count = iVar15;
      _Var8._M_pi[1]._M_weak_count = iVar2;
      uVar11 = uVar11 - 2;
      piVar5 = piVar5 + 8;
      _Var8._M_pi = _Var8._M_pi + 2;
    }
    if (uVar11 != 0) {
      iVar15 = piVar5[2];
      iVar2 = piVar5[3];
      (_Var8._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)piVar5;
      (_Var8._M_pi)->_M_use_count = iVar15;
      (_Var8._M_pi)->_M_weak_count = iVar2;
    }
  }
  if (uVar10 != length) {
    lVar6 = (long)(int)uVar10;
    do {
      *(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar6 * 4) = piVar4[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)length);
  }
  if (length != 0) {
    uVar7 = 0;
    do {
      if (*(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                          ->_vptr__Sp_counted_base + uVar7 * 4) != value) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar9 + 1) = 0x1d;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar14 != uVar7);
    _Var8._M_pi = pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    uVar11 = uVar12;
    if (3 < (int)uVar12) {
      iVar15 = uVar12 - 7;
      if (uVar12 < 7) {
        iVar15 = 0;
      }
      pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(iVar15 + 3U >> 2) * 0x40);
      memset(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
             (size_t)(pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4))
      ;
      uVar11 = (uVar12 - (iVar15 + 3U & 0x7ffffffc)) - 4;
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&_Var3._M_pi[4]._vptr__Sp_counted_base +
                    (long)&(pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                           )->_vptr__Sp_counted_base);
    }
    if (1 < (int)uVar11) {
      uVar11 = uVar11 - 2;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      _Var8._M_pi[1]._M_use_count = 0;
      _Var8._M_pi[1]._M_weak_count = 0;
      (_Var8._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (_Var8._M_pi)->_M_use_count = 0;
      (_Var8._M_pi)->_M_weak_count = 0;
      _Var8._M_pi = _Var8._M_pi + 2;
    }
    if (uVar11 != 0) {
      (_Var8._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (_Var8._M_pi)->_M_use_count = 0;
      (_Var8._M_pi)->_M_weak_count = 0;
    }
  }
  if (uVar10 != length) {
    uVar11 = uVar10 | 1;
    if ((int)(uVar10 | 1) < (int)length) {
      uVar11 = length;
    }
    memset((void *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + (long)(int)uVar10 * 4),0,
           (ulong)(~uVar10 + uVar11) * 4 + 4);
  }
  if (length != 0) {
    uVar7 = 0;
    do {
      if (*(int *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar7 * 4) != 0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar9 + 1) = 0x24;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar14 != uVar7);
    if (length != 0) {
      uVar7 = 0;
      do {
        piVar4[uVar7] = (int)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar14 != uVar7);
      _Var8._M_pi = _Var3._M_pi;
      piVar5 = piVar4;
      uVar11 = uVar12;
      if (3 < (int)uVar12) {
        do {
          iVar15 = piVar5[2];
          iVar2 = piVar5[3];
          (_Var8._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)piVar5;
          (_Var8._M_pi)->_M_use_count = iVar15;
          (_Var8._M_pi)->_M_weak_count = iVar2;
          iVar15 = piVar5[6];
          iVar2 = piVar5[7];
          _Var8._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 4);
          _Var8._M_pi[1]._M_use_count = iVar15;
          _Var8._M_pi[1]._M_weak_count = iVar2;
          iVar15 = piVar5[10];
          iVar2 = piVar5[0xb];
          _Var8._M_pi[2]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 8);
          _Var8._M_pi[2]._M_use_count = iVar15;
          _Var8._M_pi[2]._M_weak_count = iVar2;
          iVar15 = piVar5[0xe];
          iVar2 = piVar5[0xf];
          _Var8._M_pi[3]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 0xc);
          _Var8._M_pi[3]._M_use_count = iVar15;
          _Var8._M_pi[3]._M_weak_count = iVar2;
          uVar11 = uVar12 - 4;
          piVar5 = piVar5 + 0x10;
          _Var8._M_pi = _Var8._M_pi + 4;
          bVar1 = 7 < uVar12;
          uVar12 = uVar11;
        } while (bVar1);
      }
      if (1 < (int)uVar11) {
        iVar15 = piVar5[2];
        iVar2 = piVar5[3];
        (_Var8._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)piVar5;
        (_Var8._M_pi)->_M_use_count = iVar15;
        (_Var8._M_pi)->_M_weak_count = iVar2;
        iVar15 = piVar5[6];
        iVar2 = piVar5[7];
        _Var8._M_pi[1]._vptr__Sp_counted_base = *(_func_int ***)(piVar5 + 4);
        _Var8._M_pi[1]._M_use_count = iVar15;
        _Var8._M_pi[1]._M_weak_count = iVar2;
        uVar11 = uVar11 - 2;
        piVar5 = piVar5 + 8;
        _Var8._M_pi = _Var8._M_pi + 2;
      }
      if (uVar11 != 0) {
        iVar15 = piVar5[2];
        iVar2 = piVar5[3];
        (_Var8._M_pi)->_vptr__Sp_counted_base = *(_func_int ***)piVar5;
        (_Var8._M_pi)->_M_use_count = iVar15;
        (_Var8._M_pi)->_M_weak_count = iVar2;
      }
    }
  }
  if (uVar10 != length) {
    lVar6 = (long)(int)uVar10;
    do {
      *(int *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + lVar6 * 4) = piVar4[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)length);
  }
  if (length != 0) {
    uVar7 = 0;
    do {
      if (uVar7 != *(uint *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar7 * 4)) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar9 + 1) = 0x2d;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar14 != uVar7);
  }
  if ((piVar4[uVar14] == 0x7f) &&
     (*(int *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar14 * 4) == 0x3f)) {
    if (pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar9 = "void test_common(unsigned int, T) [T = int]";
  *(undefined4 *)(puVar9 + 1) = 0x31;
  *(uint *)((long)puVar9 + 0xc) = length;
  __cxa_throw(puVar9,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}